

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.cc
# Opt level: O2

InputGraph __thiscall
anon_unknown.dwarf_172fb5::read_csv
          (anon_unknown_dwarf_172fb5 *this,istream *infile,string *filename,
          optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *rename_map)

{
  char cVar1;
  pointer ptVar2;
  bool v;
  bool bVar3;
  bool e;
  istream *piVar4;
  size_type sVar5;
  reference pvVar6;
  const_iterator cVar7;
  key_type *__k;
  mapped_type *pmVar8;
  GraphFileError *pGVar9;
  int iVar10;
  pointer ptVar11;
  __node_base _Var12;
  int a;
  __node_base *p_Var13;
  bool bVar14;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>,_bool>
  pVar15;
  string_view label_00;
  string_view label_01;
  string_view l;
  string_view l_00;
  int right_idx;
  int left_idx;
  string label;
  vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  edges;
  string left;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  vertices;
  string line;
  string right;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vertex_labels;
  
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) != 0) {
    pGVar9 = (GraphFileError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertices,"error opening file",(allocator<char> *)&vertex_labels);
    GraphFileError::GraphFileError(pGVar9,filename,(string *)&vertices,false);
    __cxa_throw(pGVar9,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  vertices._M_h._M_buckets = &vertices._M_h._M_single_bucket;
  vertices._M_h._M_bucket_count = 1;
  vertex_labels._M_h._M_buckets = &vertex_labels._M_h._M_single_bucket;
  bVar3 = false;
  e = false;
  v = false;
  vertices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  vertices._M_h._M_element_count = 0;
  vertices._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  vertices._M_h._M_rehash_policy._M_next_resize = 0;
  vertices._M_h._M_single_bucket = (__node_base_ptr)0x0;
  vertex_labels._M_h._M_bucket_count = 1;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  vertex_labels._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  vertex_labels._M_h._M_element_count = 0;
  vertex_labels._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  vertex_labels._M_h._M_rehash_policy._M_next_resize = 0;
  vertex_labels._M_h._M_single_bucket = (__node_base_ptr)0x0;
  line._M_string_length = 0;
  edges.
  super__Vector_base<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edges.
  super__Vector_base<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  edges.
  super__Vector_base<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(infile,(string *)&line);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(&line,",>",0);
    if (sVar5 == 0xffffffffffffffff) {
      pGVar9 = (GraphFileError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&left,"expected a comma but didn\'t get one",(allocator<char> *)&right);
      GraphFileError::GraphFileError(pGVar9,filename,&left,true);
      __cxa_throw(pGVar9,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&left,&line,0,sVar5);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&right,&line,sVar5 + 1,0xffffffffffffffff);
    label._M_dataplus._M_p = (pointer)&label.field_2;
    label._M_string_length = 0;
    label.field_2._M_local_buf[0] = '\0';
    pvVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (&line,sVar5);
    cVar1 = *pvVar6;
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&right,',',0);
    if (sVar5 != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_88,&right,sVar5 + 1,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&label,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_88,&right,0,sVar5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&right,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((right._M_string_length == 0) && (left._M_string_length != 0)) {
      if (label._M_string_length != 0) {
        v = true;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&vertex_labels,&left,&label);
      }
      local_88._M_dataplus._M_p = (pointer)vertices._M_h._M_element_count;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string&,unsigned_long>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&vertices,&left,&local_88);
    }
    else {
      local_88._M_dataplus._M_p = (pointer)vertices._M_h._M_element_count;
      pVar15 = std::
               _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::_M_emplace<std::__cxx11::string&,unsigned_long>
                         ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)&vertices,&left,&local_88);
      left_idx = *(int *)((long)pVar15.first.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                ._M_cur.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                         + 0x28);
      local_88._M_dataplus._M_p = (pointer)vertices._M_h._M_element_count;
      pVar15 = std::
               _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::_M_emplace<std::__cxx11::string&,unsigned_long>
                         ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)&vertices,&right,&local_88);
      bVar14 = label._M_string_length != 0;
      right_idx = *(int *)((long)pVar15.first.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                 ._M_cur.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                          + 0x28);
      if (cVar1 == '>') {
        bVar3 = true;
        std::
        vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
        ::emplace_back<int&,int&,std::__cxx11::string&>
                  ((vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
                    *)&edges,&left_idx,&right_idx,&label);
      }
      else {
        std::
        vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
        ::emplace_back<int&,int&,std::__cxx11::string&>
                  ((vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
                    *)&edges,&left_idx,&right_idx,&label);
        std::
        vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
        ::emplace_back<int&,int&,std::__cxx11::string&>
                  ((vector<std::tuple<int,int,std::__cxx11::string>,std::allocator<std::tuple<int,int,std::__cxx11::string>>>
                    *)&edges,&right_idx,&left_idx,&label);
      }
      e = (bool)(e | bVar14);
    }
    std::__cxx11::string::~string((string *)&label);
    std::__cxx11::string::~string((string *)&right);
    std::__cxx11::string::~string((string *)&left);
  }
  InputGraph::InputGraph((InputGraph *)this,(int)vertices._M_h._M_element_count,v,e);
  ptVar2 = edges.
           super__Vector_base<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  p_Var13 = &vertices._M_h._M_before_begin;
  ptVar11 = edges.
            super__Vector_base<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ptVar11 == ptVar2) {
      _Var12._M_nxt = vertices._M_h._M_before_begin._M_nxt;
      do {
        if (_Var12._M_nxt == (_Hash_node_base *)0x0) {
          if (v) {
            while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
              iVar10 = *(int *)&p_Var13[5]._M_nxt;
              pmVar8 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&vertex_labels,(key_type *)(p_Var13 + 1));
              l_00._M_str = (pmVar8->_M_dataplus)._M_p;
              l_00._M_len = pmVar8->_M_string_length;
              InputGraph::set_vertex_label((InputGraph *)this,iVar10,l_00);
            }
          }
          std::__cxx11::string::~string((string *)&line);
          std::
          vector<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&edges);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&vertex_labels._M_h);
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&vertices._M_h);
          return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
                 (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)this;
        }
        iVar10 = *(int *)&_Var12._M_nxt[5]._M_nxt;
        __k = (key_type *)(_Var12._M_nxt + 1);
        if ((rename_map->
            super__Optional_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_engaged == true) {
          cVar7 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)rename_map,__k);
          if (cVar7.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            pGVar9 = (GraphFileError *)__cxa_allocate_exception(0x30);
            std::operator+(&right,"did not find a name for vertex \'",__k);
            std::operator+(&left,&right,"\'");
            GraphFileError::GraphFileError(pGVar9,filename,&left,true);
            __cxa_throw(pGVar9,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
          }
          __k = (key_type *)
                ((long)cVar7.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 0x28);
        }
        std::__cxx11::string::string((string *)&label,__k);
        l._M_str = label._M_dataplus._M_p;
        l._M_len = label._M_string_length;
        InputGraph::set_vertex_name((InputGraph *)this,iVar10,l);
        std::__cxx11::string::~string((string *)&label);
        _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt;
      } while( true );
    }
    iVar10 = (ptVar11->
             super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Head_base<1UL,_int,_false>._M_head_impl;
    a = *(int *)&(ptVar11->
                 super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).
                 super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .field_0x24;
    if (bVar3) {
LAB_00133073:
      label_01._M_str =
           (ptVar11->
           super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_dataplus._M_p;
      label_01._M_len =
           (ptVar11->
           super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .
           super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
           ._M_head_impl._M_string_length;
      InputGraph::add_directed_edge((InputGraph *)this,a,iVar10,label_01);
    }
    else {
      if (e != false) {
        label_00._M_str =
             (ptVar11->
             super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_dataplus._M_p;
        label_00._M_len =
             (ptVar11->
             super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl._M_string_length;
        InputGraph::add_directed_edge((InputGraph *)this,a,iVar10,label_00);
        a = (ptVar11->
            super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).
            super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .super__Head_base<1UL,_int,_false>._M_head_impl;
        iVar10 = *(int *)&(ptVar11->
                          super__Tuple_impl<0UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).
                          super__Tuple_impl<1UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .field_0x24;
        goto LAB_00133073;
      }
      InputGraph::add_edge((InputGraph *)this,a,iVar10);
    }
    ptVar11 = ptVar11 + 1;
  } while( true );
}

Assistant:

auto read_csv(istream && infile, const string & filename, const optional<unordered_map<string, string>> & rename_map) -> InputGraph
    {
        if (! infile)
            throw GraphFileError{filename, "error opening file", false};

        unordered_map<string, int> vertices;
        unordered_map<string, string> vertex_labels;
        vector<tuple<int, int, string>> edges;
        bool seen_vertex_label = false, seen_edge_label = false, seen_directed_edge = false;

        string line;

        while (getline(infile, line)) {
            auto pos = line.find_first_of(",>");
            if (string::npos == pos)
                throw GraphFileError{filename, "expected a comma but didn't get one", true};

            string left = line.substr(0, pos), right = line.substr(pos + 1), label;
            char delim = line.at(pos);

            auto pos2 = right.find(',');
            if (string::npos != pos2) {
                label = right.substr(pos2 + 1);
                right = right.substr(0, pos2);
            }

            if (right.empty() && ! left.empty()) {
                if (! label.empty()) {
                    seen_vertex_label = true;
                    vertex_labels.emplace(left, label);
                }

                vertices.emplace(left, vertices.size());
            }
            else {
                int left_idx = vertices.emplace(left, vertices.size()).first->second;
                int right_idx = vertices.emplace(right, vertices.size()).first->second;

                if (! label.empty())
                    seen_edge_label = true;

                if (delim == '>') {
                    seen_directed_edge = true;
                    edges.emplace_back(left_idx, right_idx, label);
                }
                else {
                    edges.emplace_back(left_idx, right_idx, label);
                    edges.emplace_back(right_idx, left_idx, label);
                }
            }
        }

        InputGraph result{int(vertices.size()), seen_vertex_label, seen_edge_label};

        for (auto & [f, t, l] : edges)
            if (seen_directed_edge)
                result.add_directed_edge(f, t, l);
            else if (seen_edge_label) {
                result.add_directed_edge(f, t, l);
                result.add_directed_edge(t, f, l);
            }
            else
                result.add_edge(f, t);

        auto rename = [&](const string & s) -> string {
            if (rename_map) {
                auto r = rename_map->find(s);
                if (r == rename_map->end())
                    throw GraphFileError{filename, "did not find a name for vertex '" + s + "'", true};
                return r->second;
            }
            else
                return s;
        };

        for (auto & [v, l] : vertices)
            result.set_vertex_name(l, rename(v));

        if (seen_vertex_label)
            for (auto & [v, l] : vertices)
                result.set_vertex_label(l, vertex_labels[v]);

        return result;
    }